

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

int32_t ra_spill(ASMState *as,IRIns *ir)

{
  uint uVar1;
  
  uVar1 = (uint)(ir->field_1).s;
  if ((ir->field_1).s != 0) goto LAB_0013842c;
  uVar1._0_2_ = *(IROpT *)((long)ir + 4);
  uVar1._2_2_ = *(IRRef1 *)((long)ir + 6);
  if ((0x604208U >> (uVar1 & 0x1f) & 1) == 0) {
    uVar1 = as->oddspill;
    if (uVar1 == 0) {
      uVar1 = as->evenspill;
      as->oddspill = uVar1 + 1;
      goto LAB_00138414;
    }
    as->oddspill = 0;
  }
  else {
    uVar1 = as->evenspill;
LAB_00138414:
    as->evenspill = uVar1 + 2;
  }
  if (0x100 < as->evenspill) {
    lj_trace_err(as->J,LJ_TRERR_SPILLOV);
  }
  (ir->field_1).s = (uint8_t)uVar1;
LAB_0013842c:
  return uVar1 << 2;
}

Assistant:

static int32_t ra_spill(ASMState *as, IRIns *ir)
{
  int32_t slot = ir->s;
  lj_assertA(ir >= as->ir + REF_TRUE,
	     "spill of K%03d", REF_BIAS - (int)(ir - as->ir));
  if (!ra_hasspill(slot)) {
    if (irt_is64(ir->t)) {
      slot = as->evenspill;
      as->evenspill += 2;
    } else if (as->oddspill) {
      slot = as->oddspill;
      as->oddspill = 0;
    } else {
      slot = as->evenspill;
      as->oddspill = slot+1;
      as->evenspill += 2;
    }
    if (as->evenspill > 256)
      lj_trace_err(as->J, LJ_TRERR_SPILLOV);
    ir->s = (uint8_t)slot;
  }
  return sps_scale(slot);
}